

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.c
# Opt level: O0

int main(void)

{
  uint uVar1;
  FILE *pFVar2;
  uint *puVar3;
  int *piVar4;
  char *pcVar5;
  tester_t *ptVar6;
  tester_t *tester_1;
  tester_t *tester;
  validator_mq_msg validator_msg;
  
  validator_msg.word[0x3e4] = '\0';
  validator_msg.word[0x3e5] = '\0';
  validator_msg.word[0x3e6] = '\0';
  validator_msg.word[999] = '\0';
  main_pid = getpid();
  children = pid_list_create(&err);
  pFVar2 = _stderr;
  if ((err & 1U) != 0) {
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    fprintf(pFVar2,"%s - error number: %d (%s)\n","Failed to create list of children pids",
            (ulong)uVar1,pcVar5);
    exit(1);
  }
  setup_sig_handlers(&err);
  pFVar2 = _stderr;
  if ((err & 1U) != 0) {
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    fprintf(pFVar2,"%s - error number: %d (%s)\n","Failed to set up signal handlers",(ulong)uVar1,
            pcVar5);
    exit(1);
  }
  tester_data = tester_list_create(&err);
  pFVar2 = _stderr;
  if ((err & 1U) != 0) {
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    fprintf(pFVar2,"%s - error number: %d (%s)\n","Failed to create tester list",(ulong)uVar1,pcVar5
           );
    exit(1);
  }
  load_automaton(&a,&err);
  pFVar2 = _stderr;
  if ((err & 1U) == 0) {
    validator_mq = validator_mq_start(true,&err);
    pFVar2 = _stderr;
    if ((err & 1U) == 0) {
      while (((halt_flag_raised ^ 0xffU) & 1) != 0) {
        validator_mq_receive(validator_mq,(validator_mq_msg *)((long)&tester + 4),&err);
        pFVar2 = _stderr;
        if ((err & 1U) != 0) {
          puVar3 = (uint *)__errno_location();
          uVar1 = *puVar3;
          piVar4 = __errno_location();
          pcVar5 = strerror(*piVar4);
          fprintf(pFVar2,"%s - error number: %d (%s)\n",
                  "Failed to receive message from validator mq",(ulong)uVar1,pcVar5);
          kill_all_exit();
        }
        ptVar6 = tester_for_request((validator_mq_msg *)((long)&tester + 4));
        handle_request_standard(ptVar6,(validator_mq_msg *)((long)&tester + 4));
      }
      while (await_runs != 0) {
        validator_mq_receive(validator_mq,(validator_mq_msg *)((long)&tester + 4),&err);
        pFVar2 = _stderr;
        if ((err & 1U) != 0) {
          puVar3 = (uint *)__errno_location();
          uVar1 = *puVar3;
          piVar4 = __errno_location();
          pcVar5 = strerror(*piVar4);
          fprintf(pFVar2,"%s - error number: %d (%s)\n",
                  "Failed to receive message from validator mq",(ulong)uVar1,pcVar5);
          kill_all_exit();
        }
        ptVar6 = tester_for_request((validator_mq_msg *)((long)&tester + 4));
        handle_request_only_finish(ptVar6,(validator_mq_msg *)((long)&tester + 4));
      }
      collect_forks(&err);
      pFVar2 = _stderr;
      if ((err & 1U) != 0) {
        puVar3 = (uint *)__errno_location();
        uVar1 = *puVar3;
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        fprintf(pFVar2,"%s - error number: %d (%s)\n",
                "Failed to collect forks created for async tasks",(ulong)uVar1,pcVar5);
        kill_all_exit();
      }
      validator_mq_finish(true,validator_mq,&err);
      pFVar2 = _stderr;
      if ((err & 1U) != 0) {
        puVar3 = (uint *)__errno_location();
        uVar1 = *puVar3;
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        fprintf(pFVar2,"%s - error number: %d (%s)\n","Failed to close validator MQ",(ulong)uVar1,
                pcVar5);
        kill_all_exit();
      }
      print_comm_summary(&comm_summary,true);
      tester_list_print_log(tester_data);
      tester_list_destroy(tester_data);
      pid_list_destroy(children);
      return 0;
    }
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    fprintf(pFVar2,"%s - error number: %d (%s)\n","Failed to start validator MQ",(ulong)uVar1,pcVar5
           );
    exit(1);
  }
  puVar3 = (uint *)__errno_location();
  uVar1 = *puVar3;
  piVar4 = __errno_location();
  pcVar5 = strerror(*piVar4);
  fprintf(pFVar2,"%s - error number: %d (%s)\n","Failed to load automaton",(ulong)uVar1,pcVar5);
  exit(1);
}

Assistant:

int main() {
    assert(err == false);
    // initial setup
    main_pid = getpid();
    children = pid_list_create(&err);
    HANDLE_ERR_EXIT_WITH_MSG("Failed to create list of children pids");
    setup_sig_handlers(&err);
    HANDLE_ERR_EXIT_WITH_MSG("Failed to set up signal handlers");
    tester_data = tester_list_create(&err);
    HANDLE_ERR_EXIT_WITH_MSG("Failed to create tester list");
    load_automaton(&a, &err);
    HANDLE_ERR_EXIT_WITH_MSG("Failed to load automaton");

    // setup queues
    validator_mq = validator_mq_start(true, &err);
    HANDLE_ERR_EXIT_WITH_MSG("Failed to start validator MQ");

    // handle incoming requests
    validator_mq_msg validator_msg;
    while(!halt_flag_raised) {
        validator_mq_receive(validator_mq, &validator_msg, &err);
        HANDLE_ERR_WITH_MSG(kill_all_exit, "Failed to receive message from validator mq");

        tester_t *tester = tester_for_request(&validator_msg);
        handle_request_standard(tester, &validator_msg);
    }
    // after halt flag is raised, wait for runs to complete and ignore other testers if necessary
    while(await_runs) {
        validator_mq_receive(validator_mq, &validator_msg, &err);
        HANDLE_ERR_WITH_MSG(kill_all_exit, "Failed to receive message from validator mq");

        tester_t *tester = tester_for_request(&validator_msg);
        handle_request_only_finish(tester, &validator_msg);
    }
    // clean up
    collect_forks(&err);
    HANDLE_ERR_WITH_MSG(kill_all_exit, "Failed to collect forks created for async tasks");

    validator_mq_finish(true, validator_mq, &err);
    HANDLE_ERR_WITH_MSG(kill_all_exit, "Failed to close validator MQ");

    print_comm_summary(&comm_summary, true);
    tester_list_print_log(tester_data);
    tester_list_destroy(tester_data);
    pid_list_destroy(children);
    return 0;
}